

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::standard_library::
          default_constructible_type<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (string *type,ModulePtr *m)

{
  element_type *this;
  shared_ptr<chaiscript::Module> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  ModulePtr MVar1;
  element_type *f;
  string local_48 [56];
  string *local_10;
  
  f = in_RDI;
  local_10 = in_RSI;
  this = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x4566c0);
  constructor<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>()>();
  std::__cxx11::string::string(local_48,local_10);
  Module::add(this,(Proxy_Function *)f,(string *)in_RDI);
  std::__cxx11::string::~string(local_48);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x45670a);
  std::shared_ptr<chaiscript::Module>::shared_ptr((shared_ptr<chaiscript::Module> *)in_RDI,in_RDX);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = f;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr default_constructible_type(const std::string &type, ModulePtr m = std::make_shared<Module>())
        {
          m->add(constructor<Type ()>(), type);
          return m;
        }